

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

int8_t getStateProp(int32_t (*stateTable) [256],int8_t *stateProps,int state)

{
  uint uVar1;
  uint uVar2;
  int32_t nextState;
  int32_t entry;
  int32_t max;
  int32_t min;
  int32_t *row;
  int state_local;
  int8_t *stateProps_local;
  int32_t (*stateTable_local) [256];
  
  stateProps[state] = '\0';
  entry = 0;
  do {
    uVar1 = stateTable[state][entry];
    uVar2 = uVar1 >> 0x18 & 0x7f;
    if (stateProps[(int)uVar2] == -1) {
      getStateProp(stateTable,stateProps,uVar2);
    }
    if ((int)uVar1 < 0) {
      if ((uVar1 >> 0x14 & 0xf) < 6) goto LAB_00195eb9;
    }
    else if (-1 < stateProps[(int)uVar2]) {
LAB_00195eb9:
      stateProps[state] = stateProps[state] | (byte)((entry >> 5) << 3);
      nextState = 0xff;
      break;
    }
    if (entry == 0xff) {
      stateProps[state] = -0x40;
      return stateProps[state];
    }
    entry = entry + 1;
  } while( true );
LAB_00195edd:
  if (nextState <= entry) {
LAB_00195f5a:
    stateProps[state] = stateProps[state] | (byte)(nextState >> 5);
    for (; entry <= nextState; entry = entry + 1) {
      uVar1 = stateTable[state][entry];
      uVar2 = uVar1 >> 0x18 & 0x7f;
      if (stateProps[(int)uVar2] == -1) {
        getStateProp(stateTable,stateProps,uVar2);
      }
      if (((int)uVar1 < 0) &&
         (stateProps[(int)uVar2] = stateProps[(int)uVar2] | 0x40, (uVar1 >> 0x14 & 0xf) < 4)) {
        stateProps[state] = stateProps[state] | 0x40;
      }
    }
    return stateProps[state];
  }
  uVar1 = stateTable[state][nextState];
  uVar2 = uVar1 >> 0x18 & 0x7f;
  if (stateProps[(int)uVar2] == -1) {
    getStateProp(stateTable,stateProps,uVar2);
  }
  if ((int)uVar1 < 0) {
    if ((uVar1 >> 0x14 & 0xf) < 6) goto LAB_00195f5a;
  }
  else if (-1 < stateProps[(int)uVar2]) goto LAB_00195f5a;
  nextState = nextState + -1;
  goto LAB_00195edd;
}

Assistant:

static int8_t
getStateProp(const int32_t (*stateTable)[256], int8_t stateProps[], int state) {
    const int32_t *row;
    int32_t min, max, entry, nextState;

    row=stateTable[state];
    stateProps[state]=0;

    /* find first non-ignorable state */
    for(min=0;; ++min) {
        entry=row[min];
        nextState=MBCS_ENTRY_STATE(entry);
        if(stateProps[nextState]==-1) {
            getStateProp(stateTable, stateProps, nextState);
        }
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            if(stateProps[nextState]>=0) {
                break;
            }
        } else if(MBCS_ENTRY_FINAL_ACTION(entry)<MBCS_STATE_UNASSIGNED) {
            break;
        }
        if(min==0xff) {
            stateProps[state]=-0x40;  /* (int8_t)0xc0 */
            return stateProps[state];
        }
    }
    stateProps[state]|=(int8_t)((min>>5)<<3);

    /* find last non-ignorable state */
    for(max=0xff; min<max; --max) {
        entry=row[max];
        nextState=MBCS_ENTRY_STATE(entry);
        if(stateProps[nextState]==-1) {
            getStateProp(stateTable, stateProps, nextState);
        }
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            if(stateProps[nextState]>=0) {
                break;
            }
        } else if(MBCS_ENTRY_FINAL_ACTION(entry)<MBCS_STATE_UNASSIGNED) {
            break;
        }
    }
    stateProps[state]|=(int8_t)(max>>5);

    /* recurse further and collect direct-state information */
    while(min<=max) {
        entry=row[min];
        nextState=MBCS_ENTRY_STATE(entry);
        if(stateProps[nextState]==-1) {
            getStateProp(stateTable, stateProps, nextState);
        }
        if(MBCS_ENTRY_IS_FINAL(entry)) {
            stateProps[nextState]|=0x40;
            if(MBCS_ENTRY_FINAL_ACTION(entry)<=MBCS_STATE_FALLBACK_DIRECT_20) {
                stateProps[state]|=0x40;
            }
        }
        ++min;
    }
    return stateProps[state];
}